

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

void core::image::save_pfm_file(ConstPtr *image,string *filename)

{
  element_type *peVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  FileException *this;
  int *piVar4;
  invalid_argument *piVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  pointer pfVar10;
  pointer pfVar11;
  long local_270;
  ofstream out;
  int aiStack_250 [54];
  ios_base local_178 [264];
  size_type *local_70;
  string magic_number;
  string scale;
  
  peVar1 = (image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Null image given");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_70 = &magic_number._M_string_length;
  magic_number._M_dataplus._M_p = (pointer)0x0;
  magic_number._M_string_length._0_1_ = 0;
  iVar2 = (peVar1->super_TypedImageBase<float>).super_ImageBase.c;
  if (iVar2 == 3) {
    pcVar6 = "PF";
  }
  else {
    if (iVar2 != 1) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar5,"Supports 1 and 3 channel images only");
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pcVar6 = "Pf";
  }
  std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)pcVar6);
  magic_number.field_2._8_8_ = &scale._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&magic_number.field_2 + 8),"-1.0","");
  std::ofstream::ofstream(&local_270,(filename->_M_dataplus)._M_p,_S_bin);
  if (*(int *)((long)aiStack_250 + *(long *)(local_270 + -0x18)) == 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_270,(char *)local_70,(long)magic_number._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_2a17d + 10,1);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&local_270,
                        (((image->
                          super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_TypedImageBase<float>).super_ImageBase.w);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(((image->
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->super_TypedImageBase<float>).super_ImageBase.h);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)magic_number.field_2._8_8_,(long)scale._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_2a17d + 10,1);
    iVar2 = (*(((image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase[3])();
    peVar1 = (image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar8 = (ulong)(peVar1->super_TypedImageBase<float>).super_ImageBase.h;
    pfVar10 = (pointer)0x0;
    if (0 < (long)uVar8) {
      pfVar11 = (peVar1->super_TypedImageBase<float>).data.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start;
      lVar7 = (long)(peVar1->super_TypedImageBase<float>).data.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pfVar11;
      if (lVar7 == 0) {
        pfVar11 = pfVar10;
      }
      pfVar11 = (pointer)((long)pfVar11 + lVar7);
      if (lVar7 == 0) {
        pfVar11 = pfVar10;
      }
      do {
        pfVar11 = (pointer)((long)pfVar11 - CONCAT44(extraout_var,iVar2) / uVar8);
        std::ostream::write((char *)&local_270,(long)pfVar11);
        uVar9 = (int)pfVar10 + 1;
        pfVar10 = (pointer)(ulong)uVar9;
      } while ((int)uVar9 <
               (((image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_TypedImageBase<float>).super_ImageBase.h);
    }
    std::ofstream::close();
    local_270 = _VTT;
    *(undefined8 *)((long)&local_270 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&out);
    std::ios_base::~ios_base(local_178);
    if ((size_type *)magic_number.field_2._8_8_ != &scale._M_string_length) {
      operator_delete((void *)magic_number.field_2._8_8_);
    }
    if (local_70 != &magic_number._M_string_length) {
      operator_delete(local_70);
    }
    return;
  }
  this = (FileException *)__cxa_allocate_exception(0x48);
  piVar4 = __errno_location();
  pcVar6 = strerror(*piVar4);
  util::FileException::FileException(this,filename,pcVar6);
  __cxa_throw(this,&util::FileException::typeinfo,util::FileException::~FileException);
}

Assistant:

void
save_pfm_file (FloatImage::ConstPtr image, std::string const& filename)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    std::string magic_number;
    if (image->channels() == 1)
        magic_number = "Pf";
    else if (image->channels() == 3)
        magic_number = "PF";
    else
        throw std::invalid_argument("Supports 1 and 3 channel images only");

#ifdef HOST_BYTEORDER_LE
    std::string scale = "-1.0"; // we currently don't support scales
#else
    std::string scale = "1.0"; // we currently don't support scales
#endif

    std::ofstream out(filename.c_str(), std::ios::binary);
    if (!out.good())
        throw util::FileException(filename, std::strerror(errno));

    out << magic_number << "\n";
    out << image->width() << " " << image->height() << " " << scale << "\n";

    /* Output rows in reverse order according to PFM specification. */
    std::size_t row_size = image->get_byte_size() / image->height();
    char const* ptr = reinterpret_cast<char const*>(image->end()) - row_size;
    for (int y = 0; y < image->height(); ++y, ptr -= row_size)
        out.write(ptr, row_size);
    out.close();
}